

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O3

yrmcds_error yrmcds_cnt_connect(yrmcds_cnt *c,char *node,uint16_t port)

{
  int iVar1;
  yrmcds_error yVar2;
  undefined8 in_RAX;
  int *piVar3;
  char *pcVar4;
  int server_fd;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  if (c != (yrmcds_cnt *)0x0) {
    iVar1 = pthread_mutex_init((pthread_mutex_t *)c,(pthread_mutexattr_t *)0x0);
    if (iVar1 == 0) {
      yVar2 = connect_to_server(node,port,&local_24);
      if (yVar2 == YRMCDS_OK) {
        c->sock = local_24;
        c->serial = 0;
        pcVar4 = (char *)malloc(0x1000);
        c->recvbuf = pcVar4;
        if (pcVar4 == (char *)0x0) {
          close(local_24);
          pthread_mutex_destroy((pthread_mutex_t *)c);
          yVar2 = YRMCDS_OUT_OF_MEMORY;
        }
        else {
          c->capacity = 0x1000;
          c->invalid = 0;
          (c->stats).records = (yrmcds_cnt_stat *)0x0;
          (c->stats).count = 0;
          (c->stats).capacity = 0;
          c->used = 0;
          c->last_size = 0;
          yVar2 = YRMCDS_OK;
        }
      }
    }
    else {
      piVar3 = __errno_location();
      *piVar3 = iVar1;
      yVar2 = YRMCDS_SYSTEM_ERROR;
    }
    return yVar2;
  }
  return YRMCDS_BAD_ARGUMENT;
}

Assistant:

yrmcds_error yrmcds_cnt_connect(yrmcds_cnt* c, const char* node, uint16_t port) {
    if( c == NULL )
        return YRMCDS_BAD_ARGUMENT;
#ifndef LIBYRMCDS_NO_INTERNAL_LOCK
    int e = pthread_mutex_init(&(c->lock), NULL);
    if( e != 0 ) {
        errno = e;
        return YRMCDS_SYSTEM_ERROR;
    }
#endif // ! LIBYRMCDS_NO_INTERNAL_LOCK
    int server_fd;
    yrmcds_error err = connect_to_server(node, port, &server_fd);
    if( err != YRMCDS_OK )
        return err;
    c->sock = server_fd;
    c->serial = 0;
    c->recvbuf = (char*)malloc(4096);
    if( c->recvbuf == NULL ) {
        close(server_fd);
#ifndef LIBYRMCDS_NO_INTERNAL_LOCK
        pthread_mutex_destroy(&(c->lock));
#endif
        return YRMCDS_OUT_OF_MEMORY;
    }
    c->capacity = 4096;
    c->used = 0;
    c->last_size = 0;
    c->invalid = 0;
    c->stats.count = c->stats.capacity = 0;
    c->stats.records = NULL;
    return YRMCDS_OK;
}